

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int hydro_pad(uchar *buf,size_t unpadded_buflen,size_t blocksize,size_t max_buflen)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  uchar mask;
  
  iVar3 = -1;
  if (max_buflen < 0x80000000 && blocksize != 0) {
    uVar6 = blocksize - 1;
    if ((blocksize & uVar6) == 0) {
      uVar6 = ~unpadded_buflen & uVar6;
    }
    else {
      uVar6 = uVar6 - unpadded_buflen % blocksize;
    }
    if ((uVar6 < ~unpadded_buflen) && (uVar4 = unpadded_buflen + uVar6, uVar4 < max_buflen)) {
      mask = '\0';
      if (blocksize != 0) {
        pbVar5 = buf + uVar4;
        uVar2 = 0;
        do {
          bVar1 = (byte)((uVar2 ^ uVar6) - 1 >> 0x38);
          *pbVar5 = bVar1 & 0x80 | *pbVar5 & mask;
          mask = mask | bVar1;
          uVar2 = uVar2 + 1;
          pbVar5 = pbVar5 + -1;
        } while (blocksize != uVar2);
      }
      iVar3 = (int)uVar4 + 1;
    }
  }
  return iVar3;
}

Assistant:

int
hydro_pad(unsigned char *buf, size_t unpadded_buflen, size_t blocksize, size_t max_buflen)
{
    unsigned char         *tail;
    size_t                 i;
    size_t                 xpadlen;
    size_t                 xpadded_len;
    volatile unsigned char mask;
    unsigned char          barrier_mask;

    if (blocksize <= 0U || max_buflen > INT_MAX) {
        return -1;
    }
    xpadlen = blocksize - 1U;
    if ((blocksize & (blocksize - 1U)) == 0U) {
        xpadlen -= unpadded_buflen & (blocksize - 1U);
    } else {
        xpadlen -= unpadded_buflen % blocksize;
    }
    if ((size_t) SIZE_MAX - unpadded_buflen <= xpadlen) {
        return -1;
    }
    xpadded_len = unpadded_buflen + xpadlen;
    if (xpadded_len >= max_buflen) {
        return -1;
    }
    tail = &buf[xpadded_len];
    mask = 0U;
    for (i = 0; i < blocksize; i++) {
        barrier_mask = (unsigned char) (((i ^ xpadlen) - 1U) >> ((sizeof(size_t) - 1U) * CHAR_BIT));
        *(tail - i)  = ((*(tail - i)) & mask) | (0x80 & barrier_mask);
        mask |= barrier_mask;
    }
    return (int) (xpadded_len + 1);
}